

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

void __thiscall
cmCTestCVS::LoadRevisions
          (cmCTestCVS *this,string *file,char *branchFlag,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions)

{
  cmCTest *this_00;
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string cvs;
  OutputLogger err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cvs_log;
  LogParser out;
  allocator_type local_8b1;
  long *local_8b0;
  long local_8a8;
  long local_8a0 [2];
  OutputLogger local_890;
  string local_850;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_830;
  undefined1 local_818 [32];
  char *local_7f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f0;
  cmCTestCVS *local_7d8 [2];
  undefined1 local_7c8 [32];
  ios_base local_7a8 [16];
  long *local_798 [2];
  long local_788 [60];
  char *local_5a8;
  char *local_378;
  char *local_148;
  Revision local_130;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_818,".",1);
  std::ostream::flush();
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0xdb,(char *)local_890.super_LineParser.super_OutputParser._vptr_OutputParser,false)
  ;
  if (local_890.super_LineParser.super_OutputParser._vptr_OutputParser !=
      (_func_int **)&local_890.super_LineParser.Prefix) {
    operator_delete(local_890.super_LineParser.super_OutputParser._vptr_OutputParser,
                    (ulong)(local_890.super_LineParser.Prefix + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
  std::ios_base::~ios_base(local_7a8);
  local_8b0 = local_8a0;
  pcVar1 = (this->super_cmCTestVC).CommandLineTool._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8b0,pcVar1,
             pcVar1 + (this->super_cmCTestVC).CommandLineTool._M_string_length);
  local_818._0_8_ = local_818 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_818,local_8b0,local_8a8 + (long)local_8b0);
  local_7f8 = local_7f0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"log","");
  local_7d8[0] = (cmCTestCVS *)local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d8,"-N","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_7c8 + 0x10),branchFlag,(allocator<char> *)&local_890);
  plVar2 = local_788;
  pcVar1 = (file->_M_dataplus)._M_p;
  local_798[0] = plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_798,pcVar1,pcVar1 + file->_M_string_length);
  __l._M_len = 5;
  __l._M_array = (iterator)local_818;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_830,__l,&local_8b1);
  lVar3 = -0xa0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  LogParser::LogParser((LogParser *)local_818,this,"log-out> ",revisions);
  cmProcessTools::OutputLogger::OutputLogger(&local_890,(this->super_cmCTestVC).Log,"log-err> ");
  local_850._M_string_length = 0;
  local_850.field_2._M_local_buf[0] = '\0';
  local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
  cmCTestVC::RunChild(&this->super_cmCTestVC,&local_830,(OutputParser *)local_818,
                      (OutputParser *)&local_890,&local_850,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p,
                    CONCAT71(local_850.field_2._M_allocated_capacity._1_7_,
                             local_850.field_2._M_local_buf[0]) + 1);
  }
  local_890.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bdd8c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890.super_LineParser.Line._M_dataplus._M_p !=
      &local_890.super_LineParser.Line.field_2) {
    operator_delete(local_890.super_LineParser.Line._M_dataplus._M_p,
                    local_890.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_818._0_8_ = &PTR__LogParser_00bd9ad0;
  cmCTestVC::Revision::~Revision(&local_130);
  if (local_148 != (char *)0x0) {
    operator_delete__(local_148);
  }
  if (local_378 != (char *)0x0) {
    operator_delete__(local_378);
  }
  if (local_5a8 != (char *)0x0) {
    operator_delete__(local_5a8);
  }
  local_818._0_8_ = &PTR__LineParser_00bdd8c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._24_8_ != &local_7f0) {
    operator_delete((void *)local_818._24_8_,local_7f0._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_830);
  if (local_8b0 != local_8a0) {
    operator_delete(local_8b0,local_8a0[0] + 1);
  }
  return;
}

Assistant:

void cmCTestCVS::LoadRevisions(std::string const& file, const char* branchFlag,
                               std::vector<Revision>& revisions)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Run "cvs log" to get revisions of this file on this branch.
  std::string cvs = this->CommandLineTool;
  std::vector<std::string> cvs_log = { cvs, "log", "-N", branchFlag, file };

  LogParser out(this, "log-out> ", revisions);
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(cvs_log, &out, &err);
}